

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ButtonEx(char *label,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  ImGuiID id;
  bool bVar4;
  bool bVar5;
  ImU32 fill_col;
  int iVar6;
  ImGuiCol idx;
  float fVar7;
  float fVar8;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 label_size;
  ImVec2 size;
  bool local_7e;
  bool local_7d;
  ImGuiID local_7c;
  undefined1 local_78 [16];
  ImRect local_60;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_7c = ImGuiWindow::GetID(this,label,(char *)0x0);
    local_50 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_60.Min.x = (this->DC).CursorPos.x;
    fVar8 = (this->DC).CursorPos.y;
    fVar7 = (pIVar3->Style).FramePadding.y;
    if (((short)flags < 0) && (fVar1 = (this->DC).CurrLineTextBaseOffset, fVar7 < fVar1)) {
      fVar8 = fVar8 + (fVar1 - fVar7);
    }
    local_78 = ZEXT416((uint)fVar8);
    fVar8 = (pIVar3->Style).FramePadding.x;
    local_38 = CalcItemSize(*size_arg,fVar8 + fVar8 + local_50.x,fVar7 + fVar7 + local_50.y);
    local_60.Max.x = local_60.Min.x + local_38.x;
    local_60.Max.y = (float)local_78._0_4_ + local_38.y;
    local_60.Min.y = (float)local_78._0_4_;
    ItemSize(&local_38,(pIVar3->Style).FramePadding.y);
    id = local_7c;
    bVar5 = false;
    bVar4 = ItemAdd(&local_60,local_7c,(ImRect *)0x0,0);
    if (bVar4) {
      bVar5 = ButtonBehavior(&local_60,id,&local_7d,&local_7e,
                             ((pIVar3->LastItemData).InFlags & 2U) << 9 | flags);
      iVar6 = ((local_7e ^ 1U) & local_7d) + 0x15;
      idx = 0x17;
      if ((local_7d & 1U) == 0) {
        idx = iVar6;
      }
      if (local_7e == false) {
        idx = iVar6;
      }
      fill_col = GetColorU32(idx,1.0);
      RenderNavHighlight(&local_60,id,1);
      IVar2.y = local_60.Min.y;
      IVar2.x = local_60.Min.x;
      RenderFrame(IVar2,local_60.Max,fill_col,true,(pIVar3->Style).FrameRounding);
      if (pIVar3->LogEnabled == true) {
        LogSetNextTextDecoration("[","]");
      }
      IVar2 = (pIVar3->Style).FramePadding;
      fVar8 = IVar2.x;
      local_40.x = local_60.Min.x + fVar8;
      fVar7 = IVar2.y;
      local_40.y = local_60.Min.y + fVar7;
      local_48.x = local_60.Max.x - fVar8;
      local_48.y = local_60.Max.y - fVar7;
      RenderTextClipped(&local_40,&local_48,label,(char *)0x0,&local_50,
                        &(pIVar3->Style).ButtonTextAlign,&local_60);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}